

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  connectdata *conn;
  FILEPROTO *pFVar5;
  timediff_t tVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  curl_slist *pcVar10;
  curl_trc_feat *pcVar11;
  bool bVar12;
  CURLcode CVar13;
  CURLcode CVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  curl_slist *item;
  curltime cVar18;
  char *rawPath;
  ftp_conn *ftpc;
  int ftpcode;
  ssize_t nread;
  ssize_t nread_1;
  char *local_68;
  int local_5c;
  ftp_conn *local_58;
  size_t local_50;
  int local_44;
  long local_40;
  ssize_t local_38;
  
  conn = data->conn;
  pFVar5 = (data->req).p.file;
  local_68 = (char *)0x0;
  local_50 = 0;
  if (pFVar5 == (FILEPROTO *)0x0) {
    return CURLE_OK;
  }
  if ((((CURLE_FILESIZE_EXCEEDED < status) ||
       ((0x80000010428e3601U >> ((ulong)status & 0x3f) & 1) == 0)) &&
      (status != CURLE_REMOTE_FILE_NOT_FOUND)) || (CVar13 = CURLE_OK, premature)) {
    *(byte *)((long)&conn->proto + 0x112) = *(byte *)((long)&conn->proto + 0x112) & 0xeb | 0x10;
    Curl_conncontrol(conn,1);
    CVar13 = status;
  }
  if (((data->state).field_0x7bf & 1) != 0) {
    if (((data->set).chunk_end != (curl_chunk_end_callback)0x0) &&
       ((conn->proto).ftpc.file != (char *)0x0)) {
      Curl_set_in_callback(data,true);
      (*(data->set).chunk_end)((data->set).wildcardptr);
      Curl_set_in_callback(data,false);
    }
    (conn->proto).ftpc.known_filesize = -1;
  }
  if (CVar13 == CURLE_OK) {
    CVar13 = Curl_urldecode(pFVar5->path,0,&local_68,&local_50,REJECT_CTRL);
  }
  local_58 = (ftp_conn *)&conn->proto;
  if (CVar13 == CURLE_OK) {
    if (((data->set).ftp_filemethod == '\x02') && (*local_68 == '/')) {
      (*Curl_cfree)(local_68);
    }
    else {
      (*Curl_cfree)((conn->proto).ftpc.prevpath);
      if ((*(byte *)((long)&conn->proto + 0x112) & 0x10) == 0) {
        if ((data->set).ftp_filemethod == '\x02') {
          local_50 = 0;
        }
        else {
          pcVar16 = (conn->proto).ftpc.file;
          if (pcVar16 == (char *)0x0) {
            sVar15 = 0;
          }
          else {
            sVar15 = strlen(pcVar16);
          }
          local_50 = local_50 - sVar15;
        }
        local_68[local_50] = '\0';
        (conn->proto).ftpc.prevpath = local_68;
      }
      else {
        (*Curl_cfree)(local_68);
        (conn->proto).ftpc.prevpath = (char *)0x0;
      }
    }
    if (((data != (Curl_easy *)0x0 && (conn->proto).ftpc.prevpath != (char *)0x0) &&
        (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 || (0 < pcVar11->log_level)))
       ) {
      Curl_infof(data,"Remembering we are in dir \"%s\"");
    }
  }
  else {
    pbVar1 = (byte *)((long)&conn->proto + 0x112);
    *pbVar1 = *pbVar1 & 0xfb;
    Curl_conncontrol(conn,1);
    (*Curl_cfree)((conn->proto).ftpc.prevpath);
    (conn->proto).ftpc.prevpath = (char *)0x0;
  }
  freedirs(local_58);
  if (conn->sock[1] != -1) {
    if (((CVar13 == CURLE_OK) &&
        (CVar13 = CURLE_OK, (*(byte *)((long)&conn->proto + 0x112) & 2) != 0)) &&
       (0 < (data->req).maxdownload)) {
      CVar14 = Curl_pp_sendf(data,&local_58->pp,"%s","ABOR");
      CVar13 = CURLE_OK;
      if (CVar14 != CURLE_OK) {
        pcVar16 = curl_easy_strerror(CVar14);
        Curl_failf(data,"Failure sending ABOR command: %s",pcVar16);
        pbVar1 = (byte *)((long)&conn->proto + 0x112);
        *pbVar1 = *pbVar1 & 0xfb;
        Curl_conncontrol(conn,1);
        CVar13 = CVar14;
      }
    }
    close_secondarysocket(data);
  }
  if (((CVar13 == CURLE_OK) && (CVar13 = CURLE_OK, pFVar5->fd == 0)) &&
     (((*(byte *)((long)&conn->proto + 0x112) & 4) != 0 &&
      ((*(byte *)((long)&conn->proto + 0x98) & 2) != 0 && !premature)))) {
    tVar6 = (conn->proto).ftpc.pp.response_time;
    (conn->proto).smbc.recv_buf = (char *)0xea60;
    cVar18 = Curl_now();
    (conn->proto).ftpc.pp.response.tv_sec = cVar18.tv_sec;
    (conn->proto).smbc.session_key = cVar18.tv_usec;
    CVar14 = Curl_GetFTPResponse(data,&local_40,&local_44);
    (conn->proto).ftpc.pp.response_time = tVar6;
    if (CVar14 == CURLE_OPERATION_TIMEDOUT && local_40 == 0) {
      Curl_failf(data,"control connection looks dead");
      pbVar1 = (byte *)((long)&conn->proto + 0x112);
      *pbVar1 = *pbVar1 & 0xfb;
      Curl_conncontrol(conn,1);
    }
    if (CVar14 == CURLE_OK) {
      bVar3 = *(byte *)((long)&conn->proto + 0x112);
      if ((bVar3 & 2) == 0) {
LAB_0012b2a7:
        CVar13 = CURLE_OK;
        bVar12 = true;
        if ((local_44 != 0xe2) && (CVar13 = CURLE_OK, local_44 != 0xfa)) {
          bVar12 = true;
          if (local_44 == 0x228) {
            Curl_failf(data,"Exceeded storage allocation");
            CVar13 = CURLE_REMOTE_DISK_FULL;
          }
          else {
            Curl_failf(data,"server did not report OK, got %d");
            CVar13 = CURLE_PARTIAL_FILE;
          }
        }
      }
      else if ((data->req).maxdownload < 1) {
        if ((bVar3 & 2) == 0) goto LAB_0012b2a7;
        CVar13 = CURLE_OK;
        bVar12 = true;
      }
      else {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 ||
            (0 < pcVar11->log_level)))) {
          Curl_infof(data,"partial download completed, closing connection");
        }
        Curl_conncontrol(conn,1);
        bVar12 = false;
        CVar13 = CURLE_OK;
      }
    }
    else {
      (*Curl_cfree)(pFVar5->freepath);
      pFVar5->freepath = (char *)0x0;
      CVar13 = CVar14;
      bVar12 = false;
    }
    if (!bVar12) {
      return CVar14;
    }
  }
  uVar17 = (ulong)CVar13;
  if (CVar13 == CURLE_OK && !premature) {
    uVar4 = *(uint *)&(data->state).field_0x7be;
    if ((uVar4 >> 0x13 & 1) == 0) {
      lVar7 = (data->req).size;
      if (((lVar7 == -1) || (lVar8 = (data->req).bytecount, lVar7 == lVar8)) ||
         ((data->req).maxdownload == lVar8)) {
        uVar17 = 0;
        if ((((*(byte *)((long)&conn->proto + 0x112) & 2) == 0) && (0 < lVar7)) &&
           (uVar17 = 0, (data->req).bytecount == 0)) {
          Curl_failf(data,"No data was received");
          uVar17 = 0x13;
        }
        goto LAB_0012b119;
      }
      Curl_failf(data,"Received only partial file: %ld bytes");
    }
    else {
      uVar17 = 0;
      if (((pFVar5->fd != 0) || (lVar7 = (data->state).infilesize, lVar7 == -1)) ||
         (((uVar9 = *(undefined8 *)&(data->set).field_0x89c,
           ((uVar4 >> 0xe | (uint)((ulong)uVar9 >> 8) & 0xffffff) & 1) != 0 ||
           (lVar7 == (data->req).writebytecount)) &&
          (((uVar4 >> 0xe & 1) == 0 && ((uint)uVar9 >> 8 & 1) == 0 ||
           (lVar7 <= (data->req).writebytecount)))))) goto LAB_0012b119;
      Curl_failf(data,"Uploaded unaligned file size (%ld out of %ld bytes)",
                 (data->req).writebytecount);
    }
    uVar17 = 0x12;
  }
LAB_0012b119:
  pFVar5->fd = 0;
  pbVar1 = (byte *)((long)&conn->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xfd;
  if ((status == CURLE_OK && (int)uVar17 == 0) && !premature) {
    for (pcVar10 = (data->set).postquote; pcVar10 != (curl_slist *)0x0; pcVar10 = pcVar10->next) {
      pcVar16 = pcVar10->data;
      if (pcVar16 != (char *)0x0) {
        local_5c = 0;
        cVar2 = *pcVar16;
        CVar13 = Curl_pp_sendf(data,&local_58->pp,"%s",pcVar16 + (cVar2 == '*'));
        if (CVar13 == CURLE_OK) {
          cVar18 = Curl_now();
          (conn->proto).ftpc.pp.response.tv_sec = cVar18.tv_sec;
          (conn->proto).smbc.session_key = cVar18.tv_usec;
          CVar13 = Curl_GetFTPResponse(data,&local_38,&local_5c);
        }
        if (CVar13 == CURLE_OK) {
          bVar12 = true;
          if ((cVar2 != '*') && (399 < local_5c)) {
            bVar12 = false;
            Curl_failf(data,"QUOT string not accepted: %s",pcVar16 + (cVar2 == '*'));
            uVar17 = 0x15;
          }
        }
        else {
          bVar12 = false;
          uVar17 = (ulong)CVar13;
        }
        if (!bVar12) goto LAB_0012b208;
      }
    }
    uVar17 = 0;
  }
LAB_0012b208:
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar11 = (data->state).feat, pcVar11 == (curl_trc_feat *)0x0 || (0 < pcVar11->log_level))))
     && (0 < Curl_trc_feat_ftp.log_level)) {
    if (data->conn == (connectdata *)0x0) {
      pcVar16 = "???";
    }
    else {
      pcVar16 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] done, result=%d",pcVar16,uVar17);
  }
  (*Curl_cfree)(pFVar5->freepath);
  pFVar5->freepath = (char *)0x0;
  return (CURLcode)uVar17;
}

Assistant:

static CURLcode ftp_done(struct Curl_easy *data, CURLcode status,
                         bool premature)
{
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL;
  size_t pathLen = 0;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
  case CURLE_OK: /* does not affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    FALLTHROUGH();
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, TRUE);
      data->set.chunk_end(data->set.wildcardptr);
      Curl_set_in_callback(data, FALSE);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the url-decoded "raw" path */
    result = Curl_urldecode(ftp->path, 0, &rawPath, &pathLen,
                            REJECT_CTRL);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    free(ftpc->prevpath);
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else { /* remember working directory for connection reuse */
    if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
      free(rawPath); /* full path => no CWDs happened => keep ftpc->prevpath */
    else {
      free(ftpc->prevpath);

      if(!ftpc->cwdfail) {
        if(data->set.ftp_filemethod == FTPFILE_NOCWD)
          pathLen = 0; /* relative path => working directory is FTP home */
        else
          /* file is url-decoded */
          pathLen -= ftpc->file ? strlen(ftpc->file) : 0;

        rawPath[pathLen] = '\0';
        ftpc->prevpath = rawPath;
      }
      else {
        free(rawPath);
        ftpc->prevpath = NULL; /* no path */
      }
    }

    if(ftpc->prevpath)
      infof(data, "Remembering we are in dir \"%s\"", ftpc->prevpath);
  }

  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we are done */

#ifdef UNDER_CE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(data, pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    close_secondarysocket(data);
  }

  if(!result && (ftp->transfer == PPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    timediff_t old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(data, &nread, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result) {
      Curl_safefree(ftp->pathalloc);
      return result;
    }

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      switch(ftpcode) {
      case 226:
      case 250:
        break;
      case 552:
        failf(data, "Exceeded storage allocation");
        result = CURLE_REMOTE_DISK_FULL;
        break;
      default:
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
        break;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->state.upload) {
    if((ftp->transfer == PPTRANSFER_BODY) &&
       (data->state.infilesize != -1) && /* upload with known size */
       ((!data->set.crlf && !data->state.prefer_ascii && /* no conversion */
         (data->state.infilesize != data->req.writebytecount)) ||
        ((data->set.crlf || data->state.prefer_ascii) && /* maybe crlf conv */
         (data->state.infilesize > data->req.writebytecount))
       )) {
      failf(data, "Uploaded unaligned file size (%" FMT_OFF_T
            " out of %" FMT_OFF_T " bytes)",
            data->req.writebytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" FMT_OFF_T " bytes",
            data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size > 0)) {
      failf(data, "No data was received");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = PPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(data, conn, data->set.postquote);
  CURL_TRC_FTP(data, "[%s] done, result=%d", FTP_DSTATE(data), result);
  Curl_safefree(ftp->pathalloc);
  return result;
}